

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

Bool Ppmd7_Alloc(CPpmd7 *p,UInt32 size)

{
  Byte *pBVar1;
  UInt32 size_local;
  CPpmd7 *p_local;
  
  if ((p->Base == (Byte *)0x0) || (p->Size != size)) {
    if (size < 0xc) {
      return 0;
    }
    Ppmd7_Free(p);
    p->AlignOffset = 4 - (size & 3);
    pBVar1 = (Byte *)malloc((ulong)(p->AlignOffset + size + 0xc));
    p->Base = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      return 0;
    }
    p->Size = size;
  }
  return 1;
}

Assistant:

static Bool Ppmd7_Alloc(CPpmd7 *p, UInt32 size)
{
  if (p->Base == 0 || p->Size != size)
  {
    /* RestartModel() below assumes that p->Size >= UNIT_SIZE
       (see the calculation of m->MinContext). */
    if (size < UNIT_SIZE) {
      return False;
    }
    Ppmd7_Free(p);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)malloc(p->AlignOffset + size
        #ifndef PPMD_32BIT
        + UNIT_SIZE
        #endif
        )) == 0)
      return False;
    p->Size = size;
  }
  return True;
}